

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::traverseParams
          (StructTranslator *this,Reader params,MemberInfo *parent,StructOrGroup *layout)

{
  bool bVar1;
  unsigned_long *puVar2;
  pair<unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> pVar3;
  pair<unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> local_a0;
  bool local_89;
  MemberInfo *local_88;
  MemberInfo *memberInfo;
  Reader param;
  Iterator IStack_48;
  uint i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_long> *__range2;
  StructOrGroup *layout_local;
  MemberInfo *parent_local;
  StructTranslator *this_local;
  
  ___begin2 = kj::indices<capnp::List<capnp::compiler::Declaration::Param,(capnp::Kind)3>::Reader&>
                        (&params);
  __end2 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin2);
  IStack_48 = kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin2);
  while( true ) {
    bVar1 = kj::Range<unsigned_long>::Iterator::operator==(&__end2,&stack0xffffffffffffffb8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    puVar2 = kj::Range<unsigned_long>::Iterator::operator*(&__end2);
    param._reader._44_4_ = SUB84(*puVar2,0);
    List<capnp::compiler::Declaration::Param,_(capnp::Kind)3>::Reader::operator[]
              ((Reader *)&memberInfo,&params,param._reader._44_4_);
    parent->childCount = parent->childCount + 1;
    local_89 = false;
    local_88 = kj::Arena::
               allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int&,capnp::compiler::Declaration::Param::Reader&,capnp::compiler::NodeTranslator::StructLayout::StructOrGroup&,bool>
                         (&this->arena,parent,(uint *)&param._reader.field_0x2c,
                          (Reader *)&memberInfo,layout,&local_89);
    kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>::
    add<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*&>
              ((Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*> *)
               &this->allMembers,&local_88);
    pVar3 = std::
            make_pair<unsigned_int&,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*&>
                      ((uint *)&param._reader.field_0x2c,&local_88);
    local_a0.second = pVar3.second;
    local_a0.first = pVar3.first;
    std::
    multimap<unsigned_int,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
    ::insert<std::pair<unsigned_int,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>
              ((multimap<unsigned_int,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
                *)&this->membersByOrdinal,&local_a0);
    kj::Range<unsigned_long>::Iterator::operator++(&__end2);
  }
  return;
}

Assistant:

void traverseParams(List<Declaration::Param>::Reader params, MemberInfo& parent,
                      StructLayout::StructOrGroup& layout) {
    for (uint i: kj::indices(params)) {
      auto param = params[i];
      parent.childCount++;
      MemberInfo* memberInfo = &arena.allocate<MemberInfo>(parent, i, param, layout, false);
      allMembers.add(memberInfo);
      membersByOrdinal.insert(std::make_pair(i, memberInfo));
    }
  }